

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropout.cpp
# Opt level: O2

int __thiscall ncnn::Dropout::forward_inplace(Dropout *this,Mat *bottom_top_blob,Option *opt)

{
  void *pvVar1;
  int i;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  int _c;
  Mat local_78;
  
  if (this->scale != 1.0) {
    uVar4 = bottom_top_blob->h * bottom_top_blob->w;
    uVar2 = 0;
    uVar5 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar5 = uVar2;
    }
    iVar3 = bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      iVar3 = 0;
    }
    while (_c = (int)uVar2, _c != iVar3) {
      Mat::channel(&local_78,bottom_top_blob,_c);
      pvVar1 = local_78.data;
      Mat::~Mat(&local_78);
      for (uVar2 = 0; uVar5 != uVar2; uVar2 = uVar2 + 1) {
        *(float *)((long)pvVar1 + uVar2 * 4) = this->scale * *(float *)((long)pvVar1 + uVar2 * 4);
      }
      uVar2 = (ulong)(_c + 1);
    }
  }
  return 0;
}

Assistant:

int Dropout::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (scale == 1.f)
    {
        return 0;
    }

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i = 0; i < size; i++)
        {
            ptr[i] = ptr[i] * scale;
        }
    }

    return 0;
}